

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,bool>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long *plVar5;
  long lVar6;
  data_ptr_t pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  undefined8 uVar9;
  element_type *peVar10;
  bool bVar11;
  LogicalType *type;
  Vector *this_00;
  Vector *pVVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  idx_t iVar14;
  ulong uVar15;
  idx_t iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long *plVar21;
  UnifiedVectorFormat sdata;
  idx_t local_110;
  idx_t local_c0;
  Value local_b8;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  local_110 = ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar11 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar18 = 0;
  }
  else {
    lVar18 = 0;
    iVar14 = 0;
    do {
      iVar16 = iVar14;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(local_78.sel)->sel_vector[iVar14];
      }
      plVar21 = (long *)**(long **)(local_78.data + iVar16 * 8);
      if (plVar21 != (long *)0x0) {
        lVar18 = (ulong)(*(long *)(*(long *)((*(long **)(local_78.data + iVar16 * 8))[1] + 8) + -8)
                         != 0 && bVar11) +
                 lVar18 + (ulong)*(uint *)(plVar21 + 3) + (plVar21[2] - *plVar21) * 8;
      }
      iVar14 = iVar14 + 1;
    } while (count != iVar14);
  }
  ListVector::Reserve(result,lVar18 + local_110);
  this_00 = MapVector::GetKeys(result);
  pVVar12 = MapVector::GetValues(result);
  if (count != 0) {
    pdVar3 = result->data;
    pdVar4 = pVVar12->data;
    uVar17 = 0;
    do {
      uVar15 = uVar17;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)(local_78.sel)->sel_vector[uVar17];
      }
      uVar1 = offset + uVar17;
      plVar21 = *(long **)(local_78.data + uVar15 * 8);
      plVar5 = (long *)*plVar21;
      if (plVar5 == (long *)0x0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_c0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_c0);
          peVar10 = local_b8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar9 = local_b8.type_._0_8_;
          local_b8.type_._0_8_ = (element_type *)0x0;
          local_b8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar9;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (local_b8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      else {
        *(idx_t *)(pdVar3 + uVar1 * 0x10) = local_110;
        lVar18 = *plVar5;
        uVar15 = (plVar5[2] - lVar18) * 8 + (ulong)*(uint *)(plVar5 + 3);
        if (uVar15 != 0) {
          lVar6 = *(long *)plVar21[1];
          pdVar7 = this_00->data;
          uVar19 = 0;
          do {
            uVar20 = uVar19 + 0x3f;
            if (-1 < (long)uVar19) {
              uVar20 = uVar19;
            }
            pdVar7[uVar19 + local_110] =
                 (*(ulong *)(lVar18 + ((long)uVar20 >> 6) * 8 + -8 +
                            (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                  (uVar19 & 0x3f) & 1) != 0;
            *(undefined8 *)(pdVar4 + uVar19 * 8 + local_110 * 8) =
                 *(undefined8 *)(lVar6 + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar19 < uVar15);
          local_110 = local_110 + uVar19;
        }
        if (bVar11 && *(long *)(*(long *)(plVar21[1] + 8) + -8) != 0) {
          OtherBucketValue(&local_b8,&this_00->type);
          Vector::SetValue(this_00,local_110,&local_b8);
          Value::~Value(&local_b8);
          *(undefined8 *)(pdVar4 + local_110 * 8) = *(undefined8 *)(*(long *)(plVar21[1] + 8) + -8);
          local_110 = local_110 + 1;
        }
        plVar21 = (long *)(pdVar3 + uVar1 * 0x10);
        plVar21[1] = local_110 - *plVar21;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != count);
  }
  ListVector::SetListSize(result,local_110);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}